

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::
     DefaultPrintTo<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
               (undefined8 param_1,
               map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *param_2,
               ostream *param_3)

{
  bool bVar1;
  reference value;
  _Self local_40;
  const_iterator end;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  iu_ostream *os_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *container_local;
  yes_t param_0_local;
  
  it._M_node = (_Base_ptr)0x0;
  std::operator<<(param_3,"{");
  end = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                  (param_2);
  local_40._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(param_2)
  ;
  do {
    bVar1 = std::operator!=(&end,&local_40);
    if (!bVar1) {
LAB_002b3411:
      if (it._M_node != (_Base_ptr)0x0) {
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((it._M_node != (_Base_ptr)0x0) &&
       (std::operator<<(param_3,","), it._M_node == (_Base_ptr)0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_002b3411;
    }
    std::operator<<(param_3," ");
    value = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*(&end);
    UniversalPrint<std::pair<int_const,int>>(value,param_3);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&end);
    it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}